

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

Expression *
slang::ast::RangeSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,ConstantRange range,ASTContext *context)

{
  SourceRange *pSVar1;
  Scope *scope;
  DeferredSourceRange sourceRange;
  DeferredSourceRange sourceRange_00;
  bool bVar2;
  Expression *pEVar3;
  RangeSelectExpression *expr;
  Type *this;
  Type *pTVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_88 [2];
  ConstantRange local_78;
  Expression *left;
  Expression *right;
  SourceLocation local_60;
  SourceLocation SStack_58;
  undefined8 local_50;
  SourceLocation local_48;
  SourceLocation SStack_40;
  undefined8 local_38;
  
  SVInt::SVInt<int>((SVInt *)local_88,range.left);
  pEVar3 = IntegerLiteral::fromConstant(compilation,(SVInt *)local_88);
  local_78 = range;
  SVInt::~SVInt((SVInt *)local_88);
  left = pEVar3;
  Expression::selfDetermined(context,&left);
  SVInt::SVInt<int>((SVInt *)local_88,range.right);
  pEVar3 = IntegerLiteral::fromConstant(compilation,(SVInt *)local_88);
  SVInt::~SVInt((SVInt *)local_88);
  right = pEVar3;
  Expression::selfDetermined(context,&right);
  local_88[0].val._0_4_ = 0;
  expr = BumpAllocator::
         emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,(RangeSelectionKind *)&local_88[0].val,
                    compilation->errorType,value,left,right,&value->sourceRange);
  bVar2 = Expression::bad(value);
  if (((!bVar2) && (bVar2 = Expression::bad(left), !bVar2)) &&
     (bVar2 = Expression::bad(right), !bVar2)) {
    pTVar4 = (value->type).ptr;
    this = getIndexedType(compilation,context,pTVar4,value->sourceRange,value->sourceRange,true);
    bVar2 = Type::isError(this);
    if (!bVar2) {
      bVar2 = Type::isUnpackedArray(pTVar4);
      scope = (context->scope).ptr;
      pSVar1 = &(expr->super_Expression).sourceRange;
      local_60 = pSVar1->startLoc;
      SStack_58 = (expr->super_Expression).sourceRange.endLoc;
      if (bVar2) {
        local_38 = 1;
        sourceRange.node.value = 1;
        sourceRange.range = *pSVar1;
        local_48 = local_60;
        SStack_40 = SStack_58;
        pTVar4 = FixedSizeUnpackedArrayType::fromDim(scope,this,local_78,sourceRange);
      }
      else {
        local_50 = 1;
        sourceRange_00.node.value = 1;
        sourceRange_00.range = *pSVar1;
        pTVar4 = PackedArrayType::fromDim(scope,this,local_78,sourceRange_00);
      }
      (expr->super_Expression).type.ptr = pTVar4;
      return &expr->super_Expression;
    }
  }
  pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& RangeSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                ConstantRange range, const ASTContext& context) {
    Expression* left = &IntegerLiteral::fromConstant(compilation, range.left);
    selfDetermined(context, left);

    Expression* right = &IntegerLiteral::fromConstant(compilation, range.right);
    selfDetermined(context, right);

    auto result = compilation.emplace<RangeSelectExpression>(RangeSelectionKind::Simple,
                                                             compilation.getErrorType(), value,
                                                             *left, *right, value.sourceRange);
    if (value.bad() || left->bad() || right->bad())
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, value.sourceRange,
                                             value.sourceRange, true);

    if (elementType.isError())
        return badExpr(compilation, result);

    // This method is only called on expressions with a fixed range type.
    SLANG_ASSERT(range.isLittleEndian() == valueType.getFixedRange().isLittleEndian());
    SLANG_ASSERT(valueType.hasFixedRange());

    if (valueType.isUnpackedArray()) {
        result->type = &FixedSizeUnpackedArrayType::fromDim(*context.scope, elementType, range,
                                                            result->sourceRange);
    }
    else {
        result->type = &PackedArrayType::fromDim(*context.scope, elementType, range,
                                                 result->sourceRange);
    }

    return *result;
}